

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptor::GetSourceLocation
          (FileDescriptor *this,vector<int,_std::allocator<int>_> *path,SourceLocation *out_location
          )

{
  int iVar1;
  int iVar2;
  LogMessage *other;
  SourceCodeInfo_Location *this_00;
  RepeatedField<int> *this_01;
  int *piVar3;
  string *psVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar5;
  const_iterator __first;
  const_iterator __last;
  RepeatedField<int> *span;
  SourceCodeInfo_Location *loc;
  byte local_61;
  LogMessage local_60;
  SourceLocation *local_28;
  SourceLocation *out_location_local;
  vector<int,_std::allocator<int>_> *path_local;
  FileDescriptor *this_local;
  
  local_61 = 0;
  local_28 = out_location;
  out_location_local = (SourceLocation *)path;
  path_local = (vector<int,_std::allocator<int>_> *)this;
  if (out_location == (SourceLocation *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0xdd4);
    local_61 = 1;
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: out_location != nullptr: ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&loc + 3),other);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  if ((*(long *)(this + 0x88) != 0) &&
     (this_00 = FileDescriptorTables::GetSourceLocation
                          (*(FileDescriptorTables **)(this + 0x80),
                           (vector<int,_std::allocator<int>_> *)out_location_local,
                           *(SourceCodeInfo **)(this + 0x88)),
     this_00 != (SourceCodeInfo_Location *)0x0)) {
    this_01 = SourceCodeInfo_Location::span(this_00);
    iVar1 = RepeatedField<int>::size(this_01);
    if ((iVar1 == 3) || (iVar1 = RepeatedField<int>::size(this_01), iVar1 == 4)) {
      piVar3 = RepeatedField<int>::Get(this_01,0);
      local_28->start_line = *piVar3;
      piVar3 = RepeatedField<int>::Get(this_01,1);
      local_28->start_column = *piVar3;
      iVar2 = RepeatedField<int>::size(this_01);
      iVar1 = 2;
      if (iVar2 == 3) {
        iVar1 = 0;
      }
      piVar3 = RepeatedField<int>::Get(this_01,iVar1);
      local_28->end_line = *piVar3;
      iVar1 = RepeatedField<int>::size(this_01);
      piVar3 = RepeatedField<int>::Get(this_01,iVar1 + -1);
      local_28->end_column = *piVar3;
      psVar4 = SourceCodeInfo_Location::leading_comments_abi_cxx11_(this_00);
      std::__cxx11::string::operator=((string *)&local_28->leading_comments,(string *)psVar4);
      psVar4 = SourceCodeInfo_Location::trailing_comments_abi_cxx11_(this_00);
      std::__cxx11::string::operator=((string *)&local_28->trailing_comments,(string *)psVar4);
      this_02 = &local_28->leading_detached_comments;
      pRVar5 = SourceCodeInfo_Location::leading_detached_comments_abi_cxx11_(this_00);
      __first = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::begin(pRVar5);
      pRVar5 = SourceCodeInfo_Location::leading_detached_comments_abi_cxx11_(this_00);
      __last = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::end(pRVar5);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      assign<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
                 (RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )__first.it_,
                 (RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )__last.it_);
      return true;
    }
  }
  return false;
}

Assistant:

bool FileDescriptor::GetSourceLocation(const std::vector<int>& path,
                                       SourceLocation* out_location) const {
  GOOGLE_CHECK(out_location != nullptr);
  if (source_code_info_) {
    if (const SourceCodeInfo_Location* loc =
            tables_->GetSourceLocation(path, source_code_info_)) {
      const RepeatedField<int32_t>& span = loc->span();
      if (span.size() == 3 || span.size() == 4) {
        out_location->start_line = span.Get(0);
        out_location->start_column = span.Get(1);
        out_location->end_line = span.Get(span.size() == 3 ? 0 : 2);
        out_location->end_column = span.Get(span.size() - 1);

        out_location->leading_comments = loc->leading_comments();
        out_location->trailing_comments = loc->trailing_comments();
        out_location->leading_detached_comments.assign(
            loc->leading_detached_comments().begin(),
            loc->leading_detached_comments().end());
        return true;
      }
    }
  }
  return false;
}